

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

void __thiscall
rcg::Interface::Interface
          (Interface *this,shared_ptr<rcg::System> *_parent,
          shared_ptr<const_rcg::GenTLWrapper> *_gentl,char *_id)

{
  char *in_RCX;
  long in_RDI;
  shared_ptr<const_rcg::GenTLWrapper> *psVar1;
  shared_ptr<const_rcg::GenTLWrapper> *this_00;
  
  std::enable_shared_from_this<rcg::Interface>::enable_shared_from_this
            ((enable_shared_from_this<rcg::Interface> *)0x117657);
  std::shared_ptr<rcg::System>::shared_ptr((shared_ptr<rcg::System> *)0x11766a);
  std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x11767d);
  std::__cxx11::string::string((string *)(in_RDI + 0x30));
  std::mutex::mutex((mutex *)0x11769e);
  psVar1 = (shared_ptr<const_rcg::GenTLWrapper> *)(in_RDI + 0x88);
  std::shared_ptr<rcg::CPort>::shared_ptr((shared_ptr<rcg::CPort> *)0x1176b3);
  this_00 = (shared_ptr<const_rcg::GenTLWrapper> *)(in_RDI + 0x98);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1176c9);
  std::vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>::vector
            ((vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_> *)
             0x1176df);
  std::shared_ptr<rcg::System>::operator=
            ((shared_ptr<rcg::System> *)this_00,(shared_ptr<rcg::System> *)psVar1);
  std::shared_ptr<const_rcg::GenTLWrapper>::operator=(this_00,psVar1);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x30),in_RCX);
  *(undefined4 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  return;
}

Assistant:

Interface::Interface(const std::shared_ptr<System> &_parent,
                     const std::shared_ptr<const GenTLWrapper> &_gentl, const char *_id)
{
  parent=_parent;
  gentl=_gentl;
  id=_id;

  n_open=0;
  ifh=0;
}